

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

uint8_t bcm2835_i2c_read_register_rs(char *regaddr,char *buf,uint32_t len)

{
  uint32_t *paddr;
  uint32_t uVar1;
  uint32_t *paddr_00;
  uint32_t *paddr_01;
  uint32_t *paddr_02;
  bool bVar2;
  uint8_t local_49;
  uint local_48;
  uint32_t uStack_44;
  uint8_t reason;
  uint32_t i;
  uint32_t remaining;
  uint32_t *control;
  uint32_t *status;
  uint32_t *fifo;
  uint32_t *dlen;
  uint32_t len_local;
  char *buf_local;
  char *regaddr_local;
  
  paddr = bcm2835_bsc1;
  paddr_00 = bcm2835_bsc1 + 2;
  paddr_01 = bcm2835_bsc1 + 4;
  paddr_02 = bcm2835_bsc1 + 1;
  local_48 = 0;
  local_49 = '\0';
  bcm2835_peri_set_bits(bcm2835_bsc1,0x20,0x20);
  bcm2835_peri_write(paddr_02,0x302);
  bcm2835_peri_write(paddr_00,1);
  bcm2835_peri_write(paddr,0x8000);
  bcm2835_peri_write(paddr_01,(int)*regaddr);
  bcm2835_peri_write(paddr,0x8080);
  do {
    uVar1 = bcm2835_peri_read(paddr_02);
    if ((uVar1 & 1) != 0) break;
    uVar1 = bcm2835_peri_read(paddr_02);
  } while ((uVar1 & 2) == 0);
  bcm2835_peri_write(paddr_00,len);
  bcm2835_peri_write(paddr,0x8081);
  bcm2835_delayMicroseconds((long)(i2c_byte_wait_us * 3));
  uStack_44 = len;
  while (uVar1 = bcm2835_peri_read(paddr_02), (uVar1 & 2) == 0) {
    while( true ) {
      bVar2 = false;
      if (uStack_44 != 0) {
        uVar1 = bcm2835_peri_read(paddr_02);
        bVar2 = (uVar1 & 0x20) != 0;
      }
      if (!bVar2) break;
      uVar1 = bcm2835_peri_read(paddr_01);
      buf[local_48] = (char)uVar1;
      local_48 = local_48 + 1;
      uStack_44 = uStack_44 - 1;
    }
  }
  while( true ) {
    bVar2 = false;
    if (uStack_44 != 0) {
      uVar1 = bcm2835_peri_read(paddr_02);
      bVar2 = (uVar1 & 0x20) != 0;
    }
    if (!bVar2) break;
    uVar1 = bcm2835_peri_read(paddr_01);
    buf[local_48] = (char)uVar1;
    local_48 = local_48 + 1;
    uStack_44 = uStack_44 - 1;
  }
  uVar1 = bcm2835_peri_read(paddr_02);
  if ((uVar1 & 0x100) == 0) {
    uVar1 = bcm2835_peri_read(paddr_02);
    if ((uVar1 & 0x200) == 0) {
      if (uStack_44 != 0) {
        local_49 = '\x04';
      }
    }
    else {
      local_49 = '\x02';
    }
  }
  else {
    local_49 = '\x01';
  }
  bcm2835_peri_set_bits(paddr,2,2);
  return local_49;
}

Assistant:

uint8_t bcm2835_i2c_read_register_rs(char* regaddr, char* buf, uint32_t len)
{   
#ifdef I2C_V1
    volatile uint32_t* dlen    = bcm2835_bsc0 + BCM2835_BSC_DLEN/4;
    volatile uint32_t* fifo    = bcm2835_bsc0 + BCM2835_BSC_FIFO/4;
    volatile uint32_t* status  = bcm2835_bsc0 + BCM2835_BSC_S/4;
    volatile uint32_t* control = bcm2835_bsc0 + BCM2835_BSC_C/4;
#else
    volatile uint32_t* dlen    = bcm2835_bsc1 + BCM2835_BSC_DLEN/4;
    volatile uint32_t* fifo    = bcm2835_bsc1 + BCM2835_BSC_FIFO/4;
    volatile uint32_t* status  = bcm2835_bsc1 + BCM2835_BSC_S/4;
    volatile uint32_t* control = bcm2835_bsc1 + BCM2835_BSC_C/4;
#endif    
	uint32_t remaining = len;
    uint32_t i = 0;
    uint8_t reason = BCM2835_I2C_REASON_OK;
    
    /* Clear FIFO */
    bcm2835_peri_set_bits(control, BCM2835_BSC_C_CLEAR_1 , BCM2835_BSC_C_CLEAR_1 );
    /* Clear Status */
    bcm2835_peri_write(status, BCM2835_BSC_S_CLKT | BCM2835_BSC_S_ERR | BCM2835_BSC_S_DONE);
    /* Set Data Length */
    bcm2835_peri_write(dlen, 1);
    /* Enable device and start transfer */
    bcm2835_peri_write(control, BCM2835_BSC_C_I2CEN);
    bcm2835_peri_write(fifo, regaddr[0]);
    bcm2835_peri_write(control, BCM2835_BSC_C_I2CEN | BCM2835_BSC_C_ST);
    
    /* poll for transfer has started */
    while ( !( bcm2835_peri_read(status) & BCM2835_BSC_S_TA ) )
    {
        /* Linux may cause us to miss entire transfer stage */
        if(bcm2835_peri_read(status) & BCM2835_BSC_S_DONE)
            break;
    }
    
    /* Send a repeated start with read bit set in address */
    bcm2835_peri_write(dlen, len);
    bcm2835_peri_write(control, BCM2835_BSC_C_I2CEN | BCM2835_BSC_C_ST  | BCM2835_BSC_C_READ );
    
    /* Wait for write to complete and first byte back. */
    bcm2835_delayMicroseconds(i2c_byte_wait_us * 3);
    
    /* wait for transfer to complete */
    while (!(bcm2835_peri_read(status) & BCM2835_BSC_S_DONE))
    {
        /* we must empty the FIFO as it is populated and not use any delay */
        while (remaining && bcm2835_peri_read(status) & BCM2835_BSC_S_RXD)
    	{
	    /* Read from FIFO */
	    buf[i] = bcm2835_peri_read(fifo);
	    i++;
	    remaining--;
    	}
    }
    
    /* transfer has finished - grab any remaining stuff in FIFO */
    while (remaining && (bcm2835_peri_read(status) & BCM2835_BSC_S_RXD))
    {
        /* Read from FIFO */
        buf[i] = bcm2835_peri_read(fifo);
        i++;
        remaining--;
    }
    
    /* Received a NACK */
    if (bcm2835_peri_read(status) & BCM2835_BSC_S_ERR)
    {
		reason = BCM2835_I2C_REASON_ERROR_NACK;
    }

    /* Received Clock Stretch Timeout */
    else if (bcm2835_peri_read(status) & BCM2835_BSC_S_CLKT)
    {
	reason = BCM2835_I2C_REASON_ERROR_CLKT;
    }

    /* Not all data is sent */
    else if (remaining)
    {
	reason = BCM2835_I2C_REASON_ERROR_DATA;
    }

    bcm2835_peri_set_bits(control, BCM2835_BSC_S_DONE , BCM2835_BSC_S_DONE);

    return reason;
}